

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void zeroblobFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int errCode;
  u64 uStack_28;
  int rc;
  i64 n;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  uStack_28 = sqlite3_value_int64(*argv);
  if ((long)uStack_28 < 0) {
    uStack_28 = 0;
  }
  errCode = sqlite3_result_zeroblob64(context,uStack_28);
  if (errCode != 0) {
    sqlite3_result_error_code(context,errCode);
  }
  return;
}

Assistant:

static void zeroblobFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  i64 n;
  int rc;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  if( n<0 ) n = 0;
  rc = sqlite3_result_zeroblob64(context, n); /* IMP: R-00293-64994 */
  if( rc ){
    sqlite3_result_error_code(context, rc);
  }
}